

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O3

MDD lddmc_make_copynode(MDD ifeq,MDD ifneq)

{
  long *plVar1;
  uint uVar2;
  uint8_t *puVar3;
  MDD MVar4;
  llmsset_t ifneq_00;
  MDD ifeq_00;
  uint value;
  long lVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  int created;
  int local_6c;
  Task local_68;
  uint64_t a;
  
  a = ifneq * 2;
  uVar6 = ifeq << 0x11 | 0x10000;
  MVar4 = llmsset_lookup(nodes,a,uVar6,&local_6c);
  if (MVar4 == 0) {
    lddmc_refs_push(ifeq);
    lddmc_refs_push(ifneq);
    local_68.f = sylvan_gc_WRAP;
    local_68.thief = (_Worker *)0x1;
    lace_run_task(&local_68);
    plVar1 = (long *)(*(long *)(in_FS_OFFSET + -0x20) + 0x28);
    *plVar1 = *plVar1 + -8;
    ifneq_00 = nodes;
    MVar4 = llmsset_lookup(nodes,a,uVar6,&local_6c);
    value = (uint)a;
    if (MVar4 == 0) {
      lddmc_make_copynode_cold_1();
      MVar4 = ifeq_00;
      if ((llmsset_t)0x1 < ifneq_00) {
        lVar5 = (long)ifneq_00 * 0x10;
        puVar3 = nodes->data;
        uVar6 = *(ulong *)(puVar3 + lVar5 + 8);
        if (((uint)uVar6 >> 0x10 & 1) != 0) {
          MVar4 = lddmc_extendnode(*(ulong *)(puVar3 + lVar5) >> 1 & 0x7fffffffffff,value,ifeq_00);
          MVar4 = lddmc_make_copynode(uVar6 >> 0x11,MVar4);
          return MVar4;
        }
        uVar2 = *(uint *)(puVar3 + lVar5 + 6);
        if (uVar2 < value) {
          MVar4 = uVar6 >> 0x11;
          ifneq_00 = (llmsset_t)
                     lddmc_extendnode(*(ulong *)(puVar3 + lVar5) >> 1 & 0x7fffffffffff,value,ifeq_00
                                     );
          value = uVar2;
        }
        else if (uVar2 == value) {
          ifneq_00 = (llmsset_t)(*(ulong *)(puVar3 + lVar5) >> 1 & 0x7fffffffffff);
        }
      }
      MVar4 = lddmc_makenode(value,MVar4,(MDD)ifneq_00);
      return MVar4;
    }
  }
  return MVar4;
}

Assistant:

MDD
lddmc_make_copynode(MDD ifeq, MDD ifneq)
{
    struct mddnode n;
    mddnode_makecopy(&n, ifneq, ifeq);

    int created;
    uint64_t index = llmsset_lookup(nodes, n.a, n.b, &created);
    if (index == 0) {
        lddmc_refs_push(ifeq);
        lddmc_refs_push(ifneq);
        RUN(sylvan_gc);
        lddmc_refs_pop(1);

        index = llmsset_lookup(nodes, n.a, n.b, &created);
        if (index == 0) {
            fprintf(stderr, "MDD Unique table full, %zu of %zu buckets filled!\n", llmsset_count_marked(nodes), llmsset_get_size(nodes));
            exit(1);
        }
    }

    if (created) sylvan_stats_count(LDD_NODES_CREATED);
    else sylvan_stats_count(LDD_NODES_REUSED);

    return (MDD)index;
}